

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

int Cbs0_ManPropagateTwo(Cbs0_Man_t *p,Gia_Obj_t *pVar)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int Value1;
  int Value0;
  Gia_Obj_t *pVar_local;
  Cbs0_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pVar);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x206,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjIsAnd(pVar);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x207,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Cbs0_VarIsAssigned(pVar);
  if (iVar1 == 0) {
    __assert_fail("Cbs0_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x208,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Cbs0_VarValue(pVar);
  if (iVar1 == 0) {
    iVar1 = Cbs0_VarFanin0Value(pVar);
    iVar2 = Cbs0_VarFanin1Value(pVar);
    if ((iVar1 == 0) || (iVar2 == 0)) {
      p_local._4_4_ = 0;
    }
    else if ((iVar1 == 1) && (iVar2 == 1)) {
      p_local._4_4_ = 1;
    }
    else {
      if ((iVar1 != 1) && (iVar2 != 1)) {
        __assert_fail("Value0 == 1 || Value1 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                      ,0x211,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
      }
      if (iVar1 == 2) {
        pGVar3 = Gia_ObjChild0(pVar);
        pGVar3 = Gia_Not(pGVar3);
        Cbs0_ManAssign(p,pGVar3);
      }
      if (iVar2 == 2) {
        pGVar3 = Gia_ObjChild1(pVar);
        pGVar3 = Gia_Not(pGVar3);
        Cbs0_ManAssign(p,pGVar3);
      }
      p_local._4_4_ = 0;
    }
    return p_local._4_4_;
  }
  __assert_fail("!Cbs0_VarValue(pVar)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                ,0x209,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Cbs0_ManPropagateTwo( Cbs0_Man_t * p, Gia_Obj_t * pVar )
{
    int Value0, Value1;
    assert( !Gia_IsComplement(pVar) );
    assert( Gia_ObjIsAnd(pVar) );
    assert( Cbs0_VarIsAssigned(pVar) );
    assert( !Cbs0_VarValue(pVar) );
    Value0 = Cbs0_VarFanin0Value(pVar);
    Value1 = Cbs0_VarFanin1Value(pVar);
    // value is 0
    if ( Value0 == 0 || Value1 == 0 ) // one is 0
        return 0;
    if ( Value0 == 1 && Value1 == 1 ) // both are 1
        return 1;
    assert( Value0 == 1 || Value1 == 1 );
    if ( Value0 == 2 ) // first is unassigned
        Cbs0_ManAssign( p, Gia_Not(Gia_ObjChild0(pVar)) );
    if ( Value1 == 2 ) // first is unassigned
        Cbs0_ManAssign( p, Gia_Not(Gia_ObjChild1(pVar)) );
    return 0;
}